

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void GEO::CmdLine::set_arg(string *name,double value)

{
  iterator iVar1;
  Environment *pEVar2;
  string local_1b0;
  string local_190 [3];
  ios_base local_120 [264];
  
  iVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
          ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
                  *)(::(anonymous_namespace)::desc_ + 0x20),name);
  if ((iVar1._M_node != (_Base_ptr)(::(anonymous_namespace)::desc_ + 0x28)) &&
     ((iVar1._M_node[4]._M_color & 0xffffffe9) != _S_red)) {
    local_190[0]._M_dataplus._M_p = (pointer)&local_190[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_190,"((type) & ~(ARG_DOUBLE | ARG_PERCENT | ARG_STRING)) == 0","");
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
               ,"");
    geo_assertion_failed(local_190,&local_1b0,0xb54);
  }
  pEVar2 = Environment::instance();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  *(undefined8 *)
   ((long)&local_190[0]._M_string_length + *(long *)(local_190[0]._M_dataplus._M_p + -0x18)) = 0x11;
  std::ostream::_M_insert<double>(value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  (*(pEVar2->super_Counted)._vptr_Counted[4])(pEVar2,name,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void set_arg(const std::string& name, double value) {
            ArgType type = get_arg_type(name);
            geo_assert_arg_type(type, ARG_DOUBLE | ARG_PERCENT | ARG_STRING);
            Environment::instance()->set_value(name, String::to_string(value));
        }